

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int share_channel_server_cmp(void *av,void *bv)

{
  share_channel *b;
  share_channel *a;
  void *bv_local;
  void *av_local;
  
  if (*(uint *)((long)av + 8) < *(uint *)((long)bv + 8)) {
    av_local._4_4_ = -1;
  }
  else if (*(uint *)((long)bv + 8) < *(uint *)((long)av + 8)) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int share_channel_server_cmp(void *av, void *bv)
{
    const struct share_channel *a = (const struct share_channel *)av;
    const struct share_channel *b = (const struct share_channel *)bv;

    if (a->server_id < b->server_id)
        return -1;
    else if (a->server_id > b->server_id)
        return +1;
    else
        return 0;
}